

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O2

void RemoveFile(char *filename)

{
  int iVar1;
  ostream *poVar2;
  allocator local_4e;
  allocator local_4d;
  Logger local_4c;
  string local_48;
  string local_28;
  
  if (filename != (char *)0x0) {
    iVar1 = remove(filename);
    if (iVar1 == -1) {
      local_4c.severity_ = FATAL;
      std::__cxx11::string::string
                ((string *)&local_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                 ,&local_4d);
      std::__cxx11::string::string((string *)&local_48,"RemoveFile",&local_4e);
      poVar2 = Logger::Start(FATAL,&local_28,0xe2,&local_48);
      std::operator<<(poVar2,"Error: invoke remove().");
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_28);
      Logger::~Logger(&local_4c);
    }
    return;
  }
  local_4c.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
             ,&local_4d);
  std::__cxx11::string::string((string *)&local_48,"RemoveFile",&local_4e);
  poVar2 = Logger::Start(ERR,&local_28,0xe0,&local_48);
  poVar2 = std::operator<<(poVar2,"CHECK failed ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xe0);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"filename");
  std::operator<<(poVar2," == NULL \n");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  Logger::~Logger(&local_4c);
  abort();
}

Assistant:

inline void RemoveFile(const char *filename) {
  CHECK_NOTNULL(filename);
  if (remove(filename) == -1) {
    LOG(FATAL) << "Error: invoke remove().";
  }
}